

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O1

void * operator_new__(size_t size)

{
  void *p;
  size_t local_28;
  debug_alloc_retry_data data;
  
  p = DebugAllocate(size,-0x4315208e);
  if (p == (void *)0x0) {
    data.size._0_4_ = 0xbceadf72;
    local_28 = size;
    p = anon_unknown.dwarf_5160::handle_oom(retry_debug_allocate,&local_28,true,false);
  }
  if (base::internal::new_hooks_ != 0) {
    tcmalloc::InvokeNewHookSlow(p,size);
  }
  if (p == (void *)0x0) {
    RAW_LOG(-4,"Unable to allocate %zu bytes: new[] failed.",size);
  }
  return p;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_newarray(size_t size) {
  void* ptr = debug_cpp_alloc(size, MallocBlock::kArrayNewType, false);
  tcmalloc::InvokeNewHook(ptr, size);
  if (ptr == nullptr) {
    RAW_LOG(FATAL, "Unable to allocate %zu bytes: new[] failed.", size);
  }
  return ptr;
}